

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O0

void __thiscall myvk::Semaphore::~Semaphore(Semaphore *this)

{
  PFN_vkDestroySemaphore p_Var1;
  element_type *this_00;
  VkDevice pVVar2;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Semaphore_00530818;
  p_Var1 = vkDestroySemaphore;
  if (in_RDI[5] != 0) {
    this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2cb795);
    pVVar2 = Device::GetHandle(this_00);
    (*p_Var1)(pVVar2,(VkSemaphore)in_RDI[5],(VkAllocationCallbacks *)0x0);
  }
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x2cb7cf);
  DeviceObjectBase::~DeviceObjectBase((DeviceObjectBase *)0x2cb7d9);
  return;
}

Assistant:

Semaphore::~Semaphore() {
	if (m_semaphore)
		vkDestroySemaphore(m_device_ptr->GetHandle(), m_semaphore, nullptr);
}